

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

float __thiscall QString::toFloat(QString *this,bool *ok)

{
  long in_FS_OFFSET;
  float fVar1;
  double d;
  QStringView local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.m_data = (this->d).ptr;
  local_20.m_size = (this->d).size;
  d = QStringView::toDouble(&local_20,ok);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    fVar1 = QLocaleData::convertDoubleToFloat(d,ok);
    return fVar1;
  }
  __stack_chk_fail();
}

Assistant:

float QString::toFloat(bool *ok) const
{
    return QLocaleData::convertDoubleToFloat(toDouble(ok), ok);
}